

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::DeleteSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *res)

{
  SQChar *pSVar1;
  SQObject *in_RDX;
  int *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr closure;
  SQObjectPtr t;
  SQObjectPtr *in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  byte in_stack_ffffffffffffff87;
  SQMetaMethod mm;
  undefined4 in_stack_ffffffffffffff90;
  SQVM *in_stack_ffffffffffffff98;
  SQObjectValue in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffac;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  SQObject *local_20;
  int *local_18;
  byte local_1;
  
  iVar2 = *in_RSI;
  if (((iVar2 == 0xa000020) || (iVar2 == 0xa000080)) || (iVar2 == 0xa008000)) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    ::SQObjectPtr::SQObjectPtr(&local_38);
    ::SQObjectPtr::SQObjectPtr(&local_48);
    if ((*(long *)(*(long *)(local_18 + 2) + 0x30) == 0) ||
       (in_stack_ffffffffffffff87 =
             (**(code **)(**(long **)(local_18 + 2) + 0x30))
                       (*(long **)(local_18 + 2),in_RDI,0xe,&local_48),
       (in_stack_ffffffffffffff87 & 1) == 0)) {
      if (*local_18 == 0xa000020) {
        in_stack_ffffffffffffff85 =
             SQTable::Get((SQTable *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (SQObjectPtr *)in_stack_ffffffffffffffa0.pTable,
                          (SQObjectPtr *)in_stack_ffffffffffffff98);
        if ((bool)in_stack_ffffffffffffff85) {
          SQTable::Remove((SQTable *)CONCAT44(iVar2,in_stack_ffffffffffffff90),(SQObjectPtr *)in_RDI
                         );
          ::SQObjectPtr::operator=
                    ((SQObjectPtr *)CONCAT44(iVar2,in_stack_ffffffffffffff90),(SQObjectPtr *)in_RDI)
          ;
          iVar2 = 0;
        }
        else {
          ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff98,local_20);
          Raise_IdxError(in_stack_ffffffffffffffa0.pThread,(SQObjectPtr *)in_stack_ffffffffffffff98)
          ;
          ::SQObjectPtr::~SQObjectPtr
                    ((SQObjectPtr *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)
                                      )));
          local_1 = 0;
          iVar2 = 1;
        }
      }
      else {
        pSVar1 = GetTypeName((SQObjectPtr *)0x13930f);
        Raise_Error(in_RDI,"cannot delete a slot from %s",pSVar1);
        local_1 = 0;
        iVar2 = 1;
      }
    }
    else {
      Push((SQVM *)CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT16(in_stack_ffffffffffffff86,
                                     CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)))
           ,in_stack_ffffffffffffff78);
      mm = (SQMetaMethod)((ulong)in_RDI >> 0x20);
      Push((SQVM *)CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT16(in_stack_ffffffffffffff86,
                                     CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)))
           ,in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff86 =
           CallMetaMethod(in_stack_ffffffffffffff98,
                          (SQObjectPtr *)CONCAT44(iVar2,in_stack_ffffffffffffff90),mm,
                          CONCAT17(in_stack_ffffffffffffff87,
                                   CONCAT16(in_stack_ffffffffffffff86,
                                            CONCAT15(in_stack_ffffffffffffff85,
                                                     in_stack_ffffffffffffff80))),
                          in_stack_ffffffffffffff78);
      iVar2 = 1;
      local_1 = in_stack_ffffffffffffff86;
    }
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80))));
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80))));
    if (iVar2 == 0) {
      local_1 = 1;
    }
  }
  else {
    pSVar1 = GetTypeName((SQObjectPtr *)0x13939d);
    Raise_Error(in_RDI,"attempt to delete a slot from a %s",pSVar1);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::DeleteSlot(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &res)
{
    switch(sq_type(self)) {
    case OT_TABLE:
    case OT_INSTANCE:
    case OT_USERDATA: {
        SQObjectPtr t;
        //bool handled = false;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_DELSLOT,closure)) {
            Push(self);Push(key);
            return CallMetaMethod(closure,MT_DELSLOT,2,res);
        }
        else {
            if(sq_type(self) == OT_TABLE) {
                if(_table(self)->Get(key,t)) {
                    _table(self)->Remove(key);
                }
                else {
                    Raise_IdxError((const SQObject &)key);
                    return false;
                }
            }
            else {
                Raise_Error(_SC("cannot delete a slot from %s"),GetTypeName(self));
                return false;
            }
        }
        res = t;
                }
        break;
    default:
        Raise_Error(_SC("attempt to delete a slot from a %s"),GetTypeName(self));
        return false;
    }
    return true;
}